

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_pooling.c
# Opt level: O0

rt_function_error_t exec_max_pooling(rt_function_t *f)

{
  pooling_context_t *context_00;
  pooling_private_t *p_00;
  pooling_private_t *p;
  max_pooling_local_context_t *context;
  rt_function_t *f_local;
  
  context_00 = (pooling_context_t *)f->local_context;
  p_00 = *f->local_context;
  if (((((p_00->calc_context).x)->field_0x10 & 0xf) == 0) &&
     ((((p_00->calc_context).y)->field_0x10 & 0xf) == 0)) {
    f_local._4_4_ = exec_pooling(f,context_00,p_00,calc_max);
  }
  else if (((((p_00->calc_context).x)->field_0x10 & 0xf) == 2) &&
          ((((p_00->calc_context).y)->field_0x10 & 0xf) == 2)) {
    f_local._4_4_ = exec_pooling_fixed8(f,context_00,p_00,calc_max_fixed8);
  }
  else if (((((p_00->calc_context).x)->field_0x10 & 0xf) == 1) &&
          ((((p_00->calc_context).y)->field_0x10 & 0xf) == 1)) {
    f_local._4_4_ = exec_pooling_fixed16(f,context_00,p_00,calc_max_fixed16);
  }
  else {
    f_local._4_4_ = exec_pooling_generic(f,context_00,p_00,calc_max_generic);
  }
  return f_local._4_4_;
}

Assistant:

rt_function_error_t exec_max_pooling(rt_function_t *f) {
  max_pooling_local_context_t *context =
      (max_pooling_local_context_t *)(f->local_context);
  pooling_private_t *p =
      (pooling_private_t *)(((max_pooling_local_context_t *)(f->local_context))
                                ->data);
  if (p->calc_context.x->type == NN_DATA_TYPE_FLOAT &&
      p->calc_context.y->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_MAXPOOLING_FLOAT32
    return exec_pooling(f, (pooling_context_t *)context, p, calc_max);
#endif /* CONFIG_MAXPOOLING_FLOAT32 */
  }

  else if (p->calc_context.x->type == NN_DATA_TYPE_INT8 &&
           p->calc_context.y->type == NN_DATA_TYPE_INT8) {
#ifdef CONFIG_MAXPOOLING_FIXED8
    return exec_pooling_fixed8(f, (pooling_context_t *)context, p,
                               calc_max_fixed8);
#endif /* CONFIG_MAXPOOLING_FIXED8 */
  }

  else if (p->calc_context.x->type == NN_DATA_TYPE_INT16 &&
           p->calc_context.y->type == NN_DATA_TYPE_INT16) {
#ifdef CONFIG_MAXPOOLING_FIXED16
    return exec_pooling_fixed16(f, (pooling_context_t *)context, p,
                                calc_max_fixed16);
#endif /* CONFIG_MAXPOOLING_FIXED16 */
  }

  else {
#ifdef CONFIG_MAXPOOLING_GENERIC
    return exec_pooling_generic(f, (pooling_context_t *)context, p,
                                calc_max_generic);
#endif /* CONFIG_MAXPOOLING_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}